

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int fillInUnixFile(unqlite_vfs *pVfs,int h,int dirfd,unqlite_file *pId,char *zFilename,int noLock,
                  int isDelete)

{
  int iVar1;
  int rc;
  unixFile *pNew;
  unqlite_io_methods *pLockingStyle;
  int noLock_local;
  char *zFilename_local;
  unqlite_file *pId_local;
  int dirfd_local;
  int h_local;
  unqlite_vfs *pVfs_local;
  
  *(int *)&pId[2].pMethods = h;
  *(int *)((long)&pId[2].pMethods + 4) = dirfd;
  *(undefined4 *)&pId[6].pMethods = 0;
  pId[7].pMethods = (unqlite_io_methods *)zFilename;
  unixEnterMutex();
  iVar1 = findInodeInfo((unixFile *)pId,(unixInodeInfo **)(pId + 1));
  pId_local._4_4_ = h;
  if (iVar1 != 0) {
    close(h);
    pId_local._4_4_ = -1;
  }
  unixLeaveMutex();
  *(undefined4 *)((long)&pId[3].pMethods + 4) = 0;
  if (iVar1 == 0) {
    pId->pMethods = &unixIoMethod;
  }
  else {
    if (-1 < dirfd) {
      close(dirfd);
    }
    if (-1 < pId_local._4_4_) {
      close(pId_local._4_4_);
    }
  }
  return iVar1;
}

Assistant:

static int fillInUnixFile(
  unqlite_vfs *pVfs,      /* Pointer to vfs object */
  int h,                  /* Open file descriptor of file being opened */
  int dirfd,              /* Directory file descriptor */
  unqlite_file *pId,      /* Write to the unixFile structure here */
  const char *zFilename,  /* Name of the file being opened */
  int noLock,             /* Omit locking if true */
  int isDelete            /* Delete on close if true */
){
  const unqlite_io_methods *pLockingStyle = &unixIoMethod;
  unixFile *pNew = (unixFile *)pId;
  int rc = UNQLITE_OK;

  /* Parameter isDelete is only used on vxworks. Express this explicitly 
  ** here to prevent compiler warnings about unused parameters.
  */
  SXUNUSED(isDelete);
  SXUNUSED(noLock);
  SXUNUSED(pVfs);

  pNew->h = h;
  pNew->dirfd = dirfd;
  pNew->fileFlags = 0;
  pNew->zPath = zFilename;
  
  unixEnterMutex();
  rc = findInodeInfo(pNew, &pNew->pInode);
  if( rc!=UNQLITE_OK ){
      /* If an error occured in findInodeInfo(), close the file descriptor
      ** immediately, before releasing the mutex. findInodeInfo() may fail
      ** in two scenarios:
      **
      **   (a) A call to fstat() failed.
      **   (b) A malloc failed.
      **
      ** Scenario (b) may only occur if the process is holding no other
      ** file descriptors open on the same file. If there were other file
      ** descriptors on this file, then no malloc would be required by
      ** findInodeInfo(). If this is the case, it is quite safe to close
      ** handle h - as it is guaranteed that no posix locks will be released
      ** by doing so.
      **
      ** If scenario (a) caused the error then things are not so safe. The
      ** implicit assumption here is that if fstat() fails, things are in
      ** such bad shape that dropping a lock or two doesn't matter much.
      */
      close(h);
      h = -1;
  }
  unixLeaveMutex();
  
  pNew->lastErrno = 0;
  if( rc!=UNQLITE_OK ){
    if( dirfd>=0 ) close(dirfd); /* silent leak if fail, already in error */
    if( h>=0 ) close(h);
  }else{
    pNew->pMethod = pLockingStyle;
  }
  return rc;
}